

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O1

int buffer_putalign(buffer *s,char *buf,uint len)

{
  int iVar1;
  uint n;
  
  do {
    n = s->n - s->p;
    if (len < n || len - n == 0) {
      byte_copy(s->x + s->p,len,buf);
      s->p = s->p + len;
      return 0;
    }
    byte_copy(s->x + s->p,n,buf);
    s->p = s->p + n;
    buf = buf + n;
    iVar1 = buffer_flush(s);
    len = len - n;
  } while (iVar1 != -1);
  return -1;
}

Assistant:

int buffer_putalign(buffer *s,const char *buf,unsigned int len)
{
  unsigned int n;
 
  while (len > (n = s->n - s->p)) {
    byte_copy(s->x + s->p,n,buf); s->p += n; buf += n; len -= n;
    if (buffer_flush(s) == -1) return -1;
  }
  /* now len <= s->n - s->p */
  byte_copy(s->x + s->p,len,buf);
  s->p += len;
  return 0;
}